

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd_eval.cpp
# Opt level: O0

void __thiscall
ON_SubDComponentParameter::ON_SubDComponentParameter
          (ON_SubDComponentParameter *this,ON_SubDEdgePtr eptr,double edge_s,
          ON_SubDFace *active_face)

{
  bool bVar1;
  ON_SubDFacePtr fptr;
  anon_union_8_3_6bf0bb0e_for_m_p0 local_78;
  anon_union_8_3_7b68a318_for_m_p1 local_4c;
  uint local_44;
  ON_SubDEdge *pOStack_40;
  uint efi;
  ON_SubDEdge *e;
  ON_SubDComponentId local_30;
  ON_SubDFace *local_28;
  ON_SubDFace *active_face_local;
  double edge_s_local;
  ON_SubDComponentParameter *this_local;
  ON_SubDEdgePtr eptr_local;
  
  this->m_cid = ON_SubDComponentId::Unset;
  local_28 = active_face;
  active_face_local = (ON_SubDFace *)edge_s;
  edge_s_local = (double)this;
  this_local = (ON_SubDComponentParameter *)eptr.m_ptr;
  memset(&this->m_p0,0,8);
  ON_SubDComponentId::ON_SubDComponentId(&(this->m_p0).v_active_e);
  memset(&this->m_p1,0,8);
  ON_SubDComponentId::ON_SubDComponentId(&(this->m_p1).v_active_f);
  e = (ON_SubDEdge *)this_local;
  ON_SubDComponentId::ON_SubDComponentId(&local_30,(ON_SubDEdgePtr)this_local);
  bVar1 = Internal_Init(this,local_30);
  if ((bVar1) &&
     (pOStack_40 = ON_SubDEdgePtr::Edge((ON_SubDEdgePtr *)&this_local),
     pOStack_40 != (ON_SubDEdge *)0x0)) {
    if (((double)active_face_local < 0.0) || (1.0 < (double)active_face_local)) {
      local_78.eptr_s = ON_DBL_QNAN;
    }
    else {
      local_78 = (anon_union_8_3_6bf0bb0e_for_m_p0)active_face_local;
    }
    this->m_p0 = local_78;
    if (local_28 != (ON_SubDFace *)0x0) {
      local_44 = ON_SubDEdge::FaceArrayIndex(pOStack_40,local_28);
      fptr = ON_SubDEdge::FacePtr(pOStack_40,local_44);
      ON_SubDComponentId::ON_SubDComponentId(&local_4c.v_active_f,fptr);
      this->m_p1 = local_4c;
    }
  }
  return;
}

Assistant:

ON_SubDComponentParameter::ON_SubDComponentParameter(
  const ON_SubDEdgePtr eptr,
  double edge_s,
  const class ON_SubDFace* active_face
)
{
  if (Internal_Init(ON_SubDComponentId(eptr)))
  {
    const ON_SubDEdge* e = eptr.Edge();
    if (nullptr != e)
    {
      m_p0.eptr_s = (edge_s >= 0.0 && edge_s <= 1.0) ? edge_s : ON_DBL_QNAN;
      if (nullptr != active_face)
      {
        const unsigned efi = e->FaceArrayIndex(active_face);
        m_p1.e_active_f = e->FacePtr(efi);
      }
    }
  }
}